

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O2

void __thiscall
ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>::Push
          (ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
           *this,pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *entry)

{
  size_type sVar1;
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> elem;
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> pStack_98;
  
  std::mutex::lock(&this->mtx);
  while( true ) {
    sVar1 = std::
            deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
            ::size((deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                    *)this);
    if (sVar1 < this->maxDepth) break;
    std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_true>(&pStack_98);
    Pop(this,&pStack_98);
    std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::~pair(&pStack_98);
  }
  std::
  deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
  ::push_back((deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
               *)this,entry);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Push(const T& entry) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! remove elements that are too old
    while (this->size() >= maxDepth) {
      T elem;
      static_cast<void>(Pop(elem));
    }
    this->push(entry);
  }